

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O1

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::var_node_update
          (RateAdaptiveCode<unsigned_int> *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_v,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *msg_c,vector<double,_std::allocator<double>_> *llrs)

{
  uint uVar1;
  uint uVar2;
  pointer pdVar3;
  pointer pvVar4;
  pointer pvVar5;
  pointer pvVar6;
  double *pdVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  long lVar13;
  double dVar14;
  vector<unsigned_int,_std::allocator<unsigned_int>_> mv_position;
  allocator_type local_49;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,this->n_cols,&local_49)
  ;
  pdVar3 = (llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (long)(llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar3;
  if (lVar9 != 0) {
    lVar9 = lVar9 >> 3;
    pvVar4 = (msg_c->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar5 = (this->pos_checkn).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (msg_v->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar11 = 0;
    do {
      dVar14 = pdVar3[lVar11];
      pdVar7 = pvVar4[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (pdVar12 = pdVar7;
          pdVar12 !=
          *(pointer *)
           ((long)&pvVar4[lVar11].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + 8); pdVar12 = pdVar12 + 1) {
        dVar14 = dVar14 + *pdVar12;
      }
      lVar8 = *(long *)&pvVar5[lVar11].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar10 = (long)*(pointer *)
                      ((long)&pvVar5[lVar11].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data + 8) - lVar8;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 2;
        lVar13 = 0;
        do {
          uVar1 = *(uint *)(lVar8 + lVar13 * 4);
          uVar2 = local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar1];
          *(double *)
           (*(long *)&pvVar6[uVar1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + (ulong)uVar2 * 8) = dVar14 - pdVar7[lVar13];
          local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1] = uVar2 + 1;
          lVar13 = lVar13 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar9 + (ulong)(lVar9 == 0));
  }
  if (local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void var_node_update(std::vector<std::vector<double>> &msg_v,
                             const std::vector<std::vector<double>> &msg_c,
                             const std::vector<double> &llrs) const {
            std::vector<idx_t> mv_position(n_cols);

            for (std::size_t m{}; m < llrs.size(); ++m) {
                const double mv_sum = std::accumulate(msg_c[m].begin(), msg_c[m].end(), llrs[m]);

                // Note: pos_checkn[m].size() = var_node_degs[m]
                for (std::size_t k{}; k < pos_checkn[m].size(); ++k) {
                    const double msg = mv_sum - msg_c[m][k];

                    // place the message at the correct position in the output array
                    const idx_t curr_pos_cn = pos_checkn[m][k];
                    msg_v[curr_pos_cn][mv_position[curr_pos_cn]] = msg;
                    mv_position[curr_pos_cn]++;
                }
            }
        }